

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O1

void __thiscall helics::apps::Clone::generateInterfaces(Clone *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  string_view queryres;
  string_view queryres_00;
  string_view queryres_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  helics *this_00;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pub;
  undefined8 *puVar4;
  string_view key;
  string_view sourceEndpoint;
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  string_view queryStr_02;
  string_view fedName;
  string_view target;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  epts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pubs;
  string local_c8;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 *local_90;
  undefined8 *local_88;
  _Alloc_hider local_78;
  size_t in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterInitializingModeIterative
            ((Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  queryStr._M_str = "global_flush";
  queryStr._M_len = 0xc;
  target._M_str = "root";
  target._M_len = 4;
  Federate::query_abi_cxx11_
            ((string *)&local_78,
             (Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),target,queryStr,
             HELICS_SEQUENCING_MODE_ORDERED);
  if (local_78._M_p != &stack0xffffffffffffff98) {
    operator_delete(local_78._M_p,(ulong)(in_stack_ffffffffffffff98 + 1));
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  queryStr_00._M_str = "publications";
  queryStr_00._M_len = 0xc;
  target_00._M_str = (this->captureFederate)._M_dataplus._M_p;
  target_00._M_len = (this->captureFederate)._M_string_length;
  Federate::query_abi_cxx11_
            (&local_c8,
             (Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),target_00,queryStr_00,
             HELICS_SEQUENCING_MODE_ORDERED);
  queryres._M_str = (char *)in_stack_ffffffffffffff98;
  queryres._M_len = in_stack_ffffffffffffff90;
  vectorizeQueryResult_abi_cxx11_(queryres);
  paVar1 = &local_c8.field_2;
  puVar4 = local_90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
    puVar4 = local_90;
  }
  for (; puVar4 != local_88; puVar4 = puVar4 + 4) {
    if (puVar4[1] != 0) {
      key._M_str = (char *)*puVar4;
      key._M_len = puVar4[1];
      addSubscription(this,key);
    }
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  queryStr_01._M_str = "endpoints";
  queryStr_01._M_len = 9;
  pcVar3 = (char *)0x9;
  target_01._M_str = (this->captureFederate)._M_dataplus._M_p;
  target_01._M_len = (this->captureFederate)._M_string_length;
  Federate::query_abi_cxx11_
            (&local_c8,
             (Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),target_01,queryStr_01,
             HELICS_SEQUENCING_MODE_ORDERED);
  queryres_00._M_str = (char *)in_stack_ffffffffffffff98;
  queryres_00._M_len = in_stack_ffffffffffffff90;
  vectorizeQueryResult_abi_cxx11_(queryres_00);
  puVar4 = local_a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
    puVar4 = local_a8;
  }
  for (; puVar4 != local_a0; puVar4 = puVar4 + 4) {
    if (puVar4[1] != 0) {
      sourceEndpoint._M_str = (char *)*puVar4;
      sourceEndpoint._M_len = puVar4[1];
      addSourceEndpointClone(this,sourceEndpoint);
    }
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    this_00 = (helics *)0x0;
  }
  else {
    this_00 = (helics *)
              ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
              (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  }
  fedName._M_str = pcVar3;
  fedName._M_len = (size_t)(this->captureFederate)._M_dataplus._M_p;
  queryFederateSubscriptions_abi_cxx11_
            (&local_c8,this_00,(Federate *)(this->captureFederate)._M_string_length,fedName);
  queryres_01._M_str = (char *)in_stack_ffffffffffffff98;
  queryres_01._M_len = in_stack_ffffffffffffff90;
  vectorizeQueryResult_abi_cxx11_(queryres_01);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->cloneSubscriptionNames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->cloneSubscriptionNames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->cloneSubscriptionNames).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->cloneSubscriptionNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->cloneSubscriptionNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->cloneSubscriptionNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((this->cloneSubscriptionNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->cloneSubscriptionNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&this->cloneSubscriptionNames,(iterator)__first._M_current,
             (this->cloneSubscriptionNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  queryStr_02._M_str = "config";
  queryStr_02._M_len = 6;
  target_02._M_str = (this->captureFederate)._M_dataplus._M_p;
  target_02._M_len = (this->captureFederate)._M_string_length;
  Federate::query_abi_cxx11_
            (&local_c8,
             (Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),target_02,queryStr_02,
             HELICS_SEQUENCING_MODE_ORDERED);
  generateInterfaces();
  return;
}

Assistant:

void Clone::generateInterfaces()
{
    fed->enterInitializingModeIterative();

    fed->query("root", "global_flush", HELICS_SEQUENCING_MODE_ORDERED);
    auto pubs = vectorizeQueryResult(
        fed->query(captureFederate, "publications", HELICS_SEQUENCING_MODE_ORDERED));
    for (auto& pub : pubs) {
        if (pub.empty()) {
            continue;
        }
        addSubscription(pub);
    }
    auto epts = vectorizeQueryResult(
        fed->query(captureFederate, "endpoints", HELICS_SEQUENCING_MODE_ORDERED));
    for (auto& ept : epts) {
        if (ept.empty()) {
            continue;
        }
        addSourceEndpointClone(ept);
    }
    cloneSubscriptionNames =
        vectorizeQueryResult(queryFederateSubscriptions(fed.get(), captureFederate));
    // get rid of any empty strings that may have come to be
    cloneSubscriptionNames.erase(std::remove(cloneSubscriptionNames.begin(),
                                             cloneSubscriptionNames.end(),
                                             std::string{}),
                                 cloneSubscriptionNames.end());

    fedConfig = fed->query(captureFederate, "config", HELICS_SEQUENCING_MODE_ORDERED);
}